

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O2

void __thiscall Mems::find_samples_next_to_mirror_fast(Mems *this,Portioner *buckets)

{
  int iVar1;
  pointer pPVar2;
  pointer pMVar3;
  pointer pMVar4;
  ostream *poVar5;
  long lVar6;
  undefined1 auVar7 [8];
  pointer pMVar8;
  value_type *__x;
  uint uVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  pointer pvVar13;
  undefined1 local_60 [8];
  vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
  point_cluster;
  
  pMVar8 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (pMVar8 == (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      poVar5 = std::operator<<((ostream *)&std::cout,"All samples for Mirrors found");
      std::operator<<(poVar5,'\n');
      for (pMVar8 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pMVar8 != (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pMVar8 = pMVar8 + 1) {
        std::
        __sort<__gnu_cxx::__normal_iterator<Point_d*,std::vector<Point_d,std::allocator<Point_d>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Point_d_const&,Point_d_const&)>>
                  ((pMVar8->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (pMVar8->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (_Iter_comp_iter<bool_(*)(const_Point_d_&,_const_Point_d_&)>)0x10e4f1);
      }
      return;
    }
    Portioner::get_bucket_cluster
              ((vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                *)local_60,buckets,&pMVar8->_position);
    uVar9 = 5;
    do {
      if (0x13 < uVar9) break;
      pPVar2 = (pMVar8->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((pMVar8->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
          super__Vector_impl_data._M_finish != pPVar2) {
        (pMVar8->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
        super__Vector_impl_data._M_finish = pPVar2;
      }
      pMVar8->_ammount_of_matching_samples = 0;
      pvVar13 = (pointer)(double)(int)(uVar9 * uVar9 * 2);
      point_cluster.
      super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar13;
      for (auVar7 = local_60;
          auVar7 != (undefined1  [8])
                    point_cluster.
                    super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          auVar7 = (undefined1  [8])((long)auVar7 + 0x18)) {
        for (__x = (((pointer)auVar7)->super__Vector_base<Point_d,_std::allocator<Point_d>_>).
                   _M_impl.super__Vector_impl_data._M_start;
            __x != (((pointer)auVar7)->super__Vector_base<Point_d,_std::allocator<Point_d>_>).
                   _M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
          dVar11 = (pMVar8->_position).x - __x->x;
          dVar10 = (pMVar8->_position).y - __x->y;
          dVar10 = dVar10 * dVar10 + dVar11 * dVar11;
          if (dVar10 <= (double)pvVar13) {
            __x->dis = dVar10;
            std::vector<Point_d,_std::allocator<Point_d>_>::push_back
                      (&pMVar8->_matching_samples,__x);
            pMVar8->_ammount_of_matching_samples = pMVar8->_ammount_of_matching_samples + 1;
            pvVar13 = point_cluster.
                      super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          }
        }
      }
      uVar9 = uVar9 + 2;
    } while ((ulong)((long)(pMVar8->_matching_samples).
                           super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pMVar8->_matching_samples).
                          super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                          super__Vector_impl_data._M_start) < 0x81);
    iVar1 = pMVar8->id;
    if (iVar1 % 10000 == 0) {
      pMVar3 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
               super__Vector_impl_data._M_start;
      pMVar4 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
               super__Vector_impl_data._M_finish;
      poVar5 = std::operator<<((ostream *)&std::cout,"Find samples for all Mems-Mirrors  ");
      lVar6 = ((long)pMVar4 - (long)pMVar3) / 0x88;
      auVar12._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar12._0_8_ = lVar6;
      auVar12._12_4_ = 0x45300000;
      poVar5 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar5,
                          (int)(((double)iVar1 /
                                ((auVar12._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0))) *
                               100.0));
      std::operator<<(poVar5," % . \n");
    }
    std::
    vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
    ::~vector((vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
               *)local_60);
    pMVar8 = pMVar8 + 1;
  } while( true );
}

Assistant:

void Mems::find_samples_next_to_mirror_fast(Portioner buckets){
        int       minfittingsamples = 999999;           //DeBUG
        int       x_y_distance;
  const int       x_y_distance_max = 20;                //maximum Distance between Mirror and Sample for x and y
        int       not_matching_mirror_ammount = 0;      //DebUG needed?

        bool      enough_samples;                       // needed?
        int       mirrornumber = 0;                     //ID

  const int       max_samples = 5;                      //max Ammount of needed Samples
  const int       min_samples = 2;


  //iterate selected_mirror all buckets
  for(auto selected_mirror = std::begin(_mems_mirrors); selected_mirror!=std::end(_mems_mirrors); ++selected_mirror){
    mirrornumber += 1;
    x_y_distance = 5;
    enough_samples = false;
    //fill vec with all relevant samplepoints with samples from mirrorbucket and buckets arround
    std::vector<std::vector<Point_d>>point_cluster = buckets.get_bucket_cluster(selected_mirror->_position);
  //  std::cout<<"id: "<<selected_mirror->id<<"\n";
  //  std::cout<<"size: \n";
/*
    int point_amm_in_cluster = 0;
    for(auto it = std::begin(point_cluster); it != std::end(point_cluster); it++){
      point_amm_in_cluster = point_amm_in_cluster+it->size();
    }

    std::cout<<"looking for samples for mirror "<< mirrornumber<<" with "<<point_amm_in_cluster<<" Points in MirrorCluster"<<"\n";
*/
    while(x_y_distance<x_y_distance_max ){
      //  while(x_y_distance<x_y_distance_max || (selected_mirror->_matching_samples.size() < min_samples)){
          selected_mirror->_matching_samples.clear();
          selected_mirror->_ammount_of_matching_samples = 0;
          //      std::cout<<" x_y_distance = "<<x_y_distance<<"\n";
          for(auto cluster_part = std::begin(point_cluster); cluster_part!=std::end(point_cluster); ++cluster_part)
          {
            for(auto point_to_check = std::begin(*cluster_part); point_to_check != std::end(*cluster_part); ++point_to_check)
            {
              //perform this actions for all Samples which are in bucket for mirror


              //----> nicht nötig          //check, if ammount of needed samples is reached
              //----> nicht nötig          //not reached: suche mit der aktuellen sample_distance in den buckets nach reached samples
                                  //  wenn distance <= (maxdis^2)*2
                                  //  put distance to point struct
                                  //  push back point to selected mirror
                                  //  incremet ammountof matching samples im selected mirror
                                  //  if ammount of matching samples = max_sample
                                  // break, go to next mems_mirror

              double sample_dis = pow(selected_mirror->_position.x-point_to_check->x , 2)+pow(selected_mirror->_position.y-point_to_check->y , 2);
              if(sample_dis<=x_y_distance*x_y_distance*2)
              {
                point_to_check->dis = sample_dis;
                selected_mirror->_matching_samples.push_back(*point_to_check);
                selected_mirror->_ammount_of_matching_samples = selected_mirror->_ammount_of_matching_samples +1;
  //              std::cout<<selected_mirror->_matching_samples.size()<<" ";

                //std::cout << "break2 \n" ;
              //  break;

              }
          //  MAXSAMPLES:
            }
          }
            if(selected_mirror->_matching_samples.size() >= max_samples){
            //  goto MAXSAMPLES;
            //    std::cout << "break1 \n" ;
            break;
            }
            x_y_distance += 2;
          }

          if(selected_mirror->id % 10000 == 0)
          {
            int progress = (int)((double)selected_mirror->id/(double)_mems_mirrors.size()*100) ;
            std::cout <<"Find samples for all Mems-Mirrors  "<< progress <<" % . \n";
          }

          if(minfittingsamples > selected_mirror->_matching_samples.size())
          {
            minfittingsamples = selected_mirror->_matching_samples.size();
            //std::cout << "Minimal fitting samples sind jetzt " <<minfittingsamples<<"\n \n";
          }
          if(minfittingsamples == 0 && selected_mirror->_matching_samples.size()==0)
          {
            not_matching_mirror_ammount += 1;
          }
        }
      //      std::cout << "not matching mirrorammount =  " <<not_matching_mirror_ammount<<"\n";
      std::cout << "All samples for Mirrors found"<< '\n';

      for(auto mirror = std::begin(_mems_mirrors); mirror != std::end(_mems_mirrors); ++mirror)
      {
        std::sort(mirror->_matching_samples.begin(), mirror->_matching_samples.end(), compare_by_distance);
      }

  }